

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O2

Status * __thiscall
draco::Encoder::EncodePointCloudToBuffer
          (Status *__return_storage_ptr__,Encoder *this,PointCloud *pc,EncoderBuffer *out_buffer)

{
  ExpertEncoder encoder;
  EncoderOptions EStack_168;
  ExpertEncoder local_d8;
  
  ExpertEncoder::ExpertEncoder(&local_d8,pc);
  CreateExpertEncoderOptions(&EStack_168,this,pc);
  ExpertEncoder::Reset(&local_d8,&EStack_168);
  EncoderOptionsBase<int>::~EncoderOptionsBase(&EStack_168);
  ExpertEncoder::EncodeToBuffer(__return_storage_ptr__,&local_d8,out_buffer);
  EncoderBase<draco::EncoderOptionsBase<int>_>::~EncoderBase
            (&local_d8.super_EncoderBase<draco::EncoderOptionsBase<int>_>);
  return __return_storage_ptr__;
}

Assistant:

Status Encoder::EncodePointCloudToBuffer(const PointCloud &pc,
                                         EncoderBuffer *out_buffer) {
  ExpertEncoder encoder(pc);
  encoder.Reset(CreateExpertEncoderOptions(pc));
  return encoder.EncodeToBuffer(out_buffer);
}